

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collider.cxx
# Opt level: O0

tuple<double,_int> __thiscall trento::Collider::sample_collision(Collider *this)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  long in_RSI;
  undefined8 in_RDI;
  double *__args;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  tuple<double,_int> tVar11;
  NucleonData *in_stack_00000008;
  NucleonData *in_stack_00000010;
  NucleonCommon *in_stack_00000018;
  bool new_collision;
  NucleonData *B;
  iterator __end3;
  iterator __begin3;
  Nucleus *__range3;
  NucleonData *A;
  iterator __end2;
  iterator __begin2;
  Nucleus *__range2;
  bool collision;
  int ncoll;
  double b;
  Nucleus *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  byte in_stack_ffffffffffffff67;
  __normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
  local_50;
  type local_48;
  reference local_40;
  NucleonData *local_38;
  __normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
  local_30;
  type local_28;
  byte local_1d;
  int local_1c;
  double local_18;
  
  local_1c = 0;
  local_1d = 0;
  do {
    uVar1 = *(ulong *)(in_RSI + 0xf8);
    uVar2 = *(ulong *)(in_RSI + 0xf8);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)(in_RSI + 0x100);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)(in_RSI + 0x100);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = -(*(double *)(in_RSI + 0xf8) * *(double *)(in_RSI + 0xf8));
    auVar5 = vfmadd213sd_fma(auVar5,auVar7,auVar9);
    __args = auVar5._0_8_;
    dVar4 = random::canonical<double>();
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar1;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar2;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (double)__args * dVar4;
    auVar5 = vfmadd213sd_fma(auVar6,auVar8,auVar10);
    local_18 = sqrt(auVar5._0_8_);
    std::unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_>::operator->
              ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_> *)0x12a033);
    Nucleus::sample_nucleons
              ((Nucleus *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
               (double)in_stack_ffffffffffffff58);
    std::unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_>::operator->
              ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_> *)0x12a05f);
    Nucleus::sample_nucleons
              ((Nucleus *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
               (double)in_stack_ffffffffffffff58);
    local_28 = std::unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_>::operator*
                         ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_> *)
                          CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    local_30._M_current = (NucleonData *)Nucleus::begin(in_stack_ffffffffffffff58);
    local_38 = (NucleonData *)Nucleus::end(in_stack_ffffffffffffff58);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                         (__normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
                          *)in_stack_ffffffffffffff58);
      if (!bVar3) break;
      local_40 = __gnu_cxx::
                 __normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
                 ::operator*(&local_30);
      local_48 = std::unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_>::operator*
                           ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_> *)
                            CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      local_50._M_current = (NucleonData *)Nucleus::begin(in_stack_ffffffffffffff58);
      Nucleus::end(in_stack_ffffffffffffff58);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                           (__normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
                            *)in_stack_ffffffffffffff58);
        if (!bVar3) break;
        __gnu_cxx::
        __normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
        ::operator*(&local_50);
        bVar3 = NucleonCommon::participate(in_stack_00000018,in_stack_00000010,in_stack_00000008);
        if ((bVar3) && ((*(byte *)(in_RSI + 0xf4) & 1) != 0)) {
          local_1c = local_1c + 1;
        }
        in_stack_ffffffffffffff67 = 1;
        if (!bVar3) {
          in_stack_ffffffffffffff67 = local_1d;
        }
        local_1d = in_stack_ffffffffffffff67 & 1;
        __gnu_cxx::
        __normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
        ::operator++(&local_50);
      }
      __gnu_cxx::
      __normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
      ::operator++(&local_30);
    }
  } while (((local_1d ^ 0xff) & 1) != 0);
  tVar11 = std::make_tuple<double&,int&>
                     (__args,(int *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  tVar11.super__Tuple_impl<0UL,_double,_int>._0_8_ = in_RDI;
  return (tuple<double,_int>)tVar11.super__Tuple_impl<0UL,_double,_int>;
}

Assistant:

std::tuple<double, int> Collider::sample_collision() {
  // Sample impact parameters until at least one nucleon-nucleon pair
  // participates.  The bool 'collision' keeps track -- it is effectively a
  // logical OR over all possible participant pairs.
  // Returns the sampled impact parameter b, and binary collision number ncoll.
  double b;
  int ncoll = 0;
  bool collision = false;

  do {
    // Sample b from P(b)db = 2*pi*b.
    b = std::sqrt(bmin_ * bmin_ + (bmax_ * bmax_ - bmin_ * bmin_) * random::canonical<double>());

    // Offset each nucleus depending on the asymmetry parameter (see header).
    nucleusA_->sample_nucleons(asymmetry_ * b);
    nucleusB_->sample_nucleons((asymmetry_ - 1.) * b);

    // Check each nucleon-nucleon pair.
    for (auto&& A : *nucleusA_) {
      for (auto&& B : *nucleusB_) {
        auto new_collision = nucleon_common_.participate(A, B);
        if (new_collision && calc_ncoll_) ++ncoll;
        collision = new_collision || collision;
      }
    }
  } while (!collision);

  return std::make_tuple(b, ncoll);
}